

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::unget(CTcTokenizer *this,CTcToken *prv)

{
  char *pcVar1;
  ulong uVar2;
  tc_toktyp_t tVar3;
  undefined4 uVar4;
  
  push(this,&this->curtok_);
  (this->curtok_).field_0x20 = prv->field_0x20;
  tVar3 = prv->typ_;
  uVar4 = *(undefined4 *)&prv->field_0x4;
  pcVar1 = prv->text_;
  uVar2 = prv->int_val_;
  (this->curtok_).text_len_ = prv->text_len_;
  (this->curtok_).int_val_ = uVar2;
  (this->curtok_).typ_ = tVar3;
  *(undefined4 *)&(this->curtok_).field_0x4 = uVar4;
  (this->curtok_).text_ = pcVar1;
  (this->prvtok_).typ_ = TOKT_INVALID;
  return;
}

Assistant:

void CTcTokenizer::unget(const CTcToken *prv)
{
    /* push the current token onto the unget stack */
    push(&curtok_);

    /* go back to the previous token */
    curtok_ = *prv;

    /* the internally saved previous token is no longer valid */
    prvtok_.settyp(TOKT_INVALID);
}